

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int16_t iVar1;
  ushort uVar2;
  int *piVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint uVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  char *pcVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  short sVar28;
  uint uVar29;
  undefined4 uVar30;
  ulong uVar31;
  char *__format;
  uint uVar32;
  int iVar33;
  ushort uVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  uint uVar41;
  uint uVar43;
  int16_t iVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  int16_t *local_3a8;
  ulong local_3a0;
  ulong local_398;
  ulong local_390;
  ulong local_388;
  ulong local_380;
  long local_330;
  ulong local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  undefined1 local_2a0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  short local_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short sStack_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short sStack_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  undefined2 local_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 uStack_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined1 local_e0 [32];
  undefined2 local_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 local_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 local_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 uStack_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  int iVar42;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar24 = "_s2";
  }
  else {
    uVar39 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar24 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar24 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar24 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar24 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_0075baf4:
        iVar13 = matrix->min;
        iVar42 = -iVar13;
        if (iVar13 != -open && SBORROW4(iVar13,-open) == iVar13 + open < 0) {
          iVar42 = open;
        }
        uVar41 = iVar42 - 0x7fff;
        sVar28 = 0x7ffe - (short)matrix->max;
        iVar44 = (int16_t)uVar41;
        local_140._2_2_ = iVar44;
        local_140._0_2_ = iVar44;
        local_140._4_2_ = iVar44;
        local_140._6_2_ = iVar44;
        local_140._8_2_ = iVar44;
        local_140._10_2_ = iVar44;
        local_140._12_2_ = iVar44;
        local_140._14_2_ = iVar44;
        local_140._16_2_ = iVar44;
        local_140._18_2_ = iVar44;
        local_140._20_2_ = iVar44;
        local_140._22_2_ = iVar44;
        local_140._24_2_ = iVar44;
        local_140._26_2_ = iVar44;
        local_140._28_2_ = iVar44;
        local_140._30_2_ = iVar44;
        local_1c0._2_2_ = iVar44;
        local_1c0._0_2_ = iVar44;
        local_1c0._4_2_ = iVar44;
        local_1c0._6_2_ = iVar44;
        local_1c0._8_2_ = iVar44;
        local_1c0._10_2_ = iVar44;
        local_1c0._12_2_ = iVar44;
        local_1c0._14_2_ = iVar44;
        local_1c0._16_2_ = iVar44;
        local_1c0._18_2_ = iVar44;
        local_1c0._20_2_ = iVar44;
        local_1c0._22_2_ = iVar44;
        local_1c0._24_2_ = iVar44;
        local_1c0._26_2_ = iVar44;
        local_1c0._28_2_ = iVar44;
        local_1c0._30_2_ = iVar44;
        ppVar14 = parasail_result_new_table1(_s1Len,s2Len);
        if (ppVar14 != (parasail_result_t *)0x0) {
          ppVar14->flag = ppVar14->flag | 0x10221004;
          uVar31 = (ulong)(s2Len + 0x1e);
          ptr = parasail_memalign_int16_t(0x20,uVar31);
          ptr_00 = parasail_memalign_int16_t(0x20,uVar31);
          ptr_01 = parasail_memalign_int16_t(0x20,uVar31);
          if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
            lVar40 = (long)_s1Len;
            if (matrix->type == 0) {
              local_3a8 = parasail_memalign_int16_t(0x20,(long)(int)(_s1Len + 0xf));
              if (local_3a8 == (int16_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              for (uVar31 = 0; lVar27 = lVar40, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar31;
                  uVar31 = uVar31 + 1) {
                local_3a8[uVar31] = (int16_t)matrix->mapper[(byte)_s1[uVar31]];
              }
              for (; lVar27 < (int)(_s1Len + 0xf); lVar27 = lVar27 + 1) {
                local_3a8[lVar27] = 0;
              }
            }
            else {
              local_3a8 = (int16_t *)0x0;
            }
            uVar15 = s2Len + 0xf;
            local_120 = sVar28;
            sStack_11e = sVar28;
            sStack_11c = sVar28;
            sStack_11a = sVar28;
            sStack_118 = sVar28;
            sStack_116 = sVar28;
            sStack_114 = sVar28;
            sStack_112 = sVar28;
            sStack_110 = sVar28;
            sStack_10e = sVar28;
            sStack_10c = sVar28;
            sStack_10a = sVar28;
            sStack_108 = sVar28;
            sStack_106 = sVar28;
            sStack_104 = sVar28;
            sStack_102 = sVar28;
            auVar47._2_2_ = iVar44;
            auVar47._0_2_ = iVar44;
            auVar47._4_2_ = iVar44;
            auVar47._6_2_ = iVar44;
            auVar47._8_2_ = iVar44;
            auVar47._10_2_ = iVar44;
            auVar47._12_2_ = iVar44;
            auVar47._14_2_ = iVar44;
            auVar9._16_2_ = iVar44;
            auVar9._0_16_ = auVar47;
            auVar9._18_2_ = iVar44;
            auVar9._20_2_ = iVar44;
            auVar9._22_2_ = iVar44;
            auVar9._24_2_ = iVar44;
            auVar9._26_2_ = iVar44;
            auVar9._28_2_ = iVar44;
            auVar9._30_2_ = iVar44;
            auVar45 = vpslldq_avx2(ZEXT1632(auVar47),0xe);
            local_e0 = vpblendw_avx2(auVar9,auVar45,0x80);
            local_80 = (undefined2)open;
            uStack_7e = local_80;
            uStack_7c = local_80;
            uStack_7a = local_80;
            uStack_78 = local_80;
            uStack_76 = local_80;
            uStack_74 = local_80;
            uStack_72 = local_80;
            uStack_70 = local_80;
            uStack_6e = local_80;
            uStack_6c = local_80;
            uStack_6a = local_80;
            uStack_68 = local_80;
            uStack_66 = local_80;
            uStack_64 = local_80;
            uStack_62 = local_80;
            local_a0 = (undefined2)gap;
            uStack_9e = local_a0;
            uStack_9c = local_a0;
            uStack_9a = local_a0;
            uStack_98 = local_a0;
            uStack_96 = local_a0;
            uStack_94 = local_a0;
            uStack_92 = local_a0;
            uStack_90 = local_a0;
            uStack_8e = local_a0;
            uStack_8c = local_a0;
            uStack_8a = local_a0;
            uStack_88 = local_a0;
            uStack_86 = local_a0;
            uStack_84 = local_a0;
            uStack_82 = local_a0;
            local_100 = (undefined2)_s1Len;
            uStack_fe = local_100;
            uStack_fc = local_100;
            uStack_fa = local_100;
            uStack_f8 = local_100;
            uStack_f6 = local_100;
            uStack_f4 = local_100;
            uStack_f2 = local_100;
            uStack_f0 = local_100;
            uStack_ee = local_100;
            uStack_ec = local_100;
            uStack_ea = local_100;
            uStack_e8 = local_100;
            uStack_e6 = local_100;
            uStack_e4 = local_100;
            uStack_e2 = local_100;
            local_c0 = (undefined2)s2Len;
            uStack_be = local_c0;
            uStack_bc = local_c0;
            uStack_ba = local_c0;
            uStack_b8 = local_c0;
            uStack_b6 = local_c0;
            uStack_b4 = local_c0;
            uStack_b2 = local_c0;
            uStack_b0 = local_c0;
            uStack_ae = local_c0;
            uStack_ac = local_c0;
            uStack_aa = local_c0;
            uStack_a8 = local_c0;
            uStack_a6 = local_c0;
            uStack_a4 = local_c0;
            uStack_a2 = local_c0;
            piVar3 = matrix->mapper;
            for (uVar31 = 0; uVar39 != uVar31; uVar31 = uVar31 + 1) {
              ptr[uVar31 + 0xf] = (int16_t)piVar3[(byte)_s2[uVar31]];
            }
            for (lVar27 = 0; uVar31 = uVar39, lVar27 != 0xf; lVar27 = lVar27 + 1) {
              ptr[lVar27] = 0;
            }
            for (; (int)uVar31 < (int)uVar15; uVar31 = uVar31 + 1) {
              ptr[uVar31 + 0xf] = 0;
            }
            for (uVar31 = 0; uVar39 != uVar31; uVar31 = uVar31 + 1) {
              ptr_00[uVar31 + 0xf] = 0;
              ptr_01[uVar31 + 0xf] = iVar44;
            }
            for (lVar27 = 0; uVar31 = uVar39, lVar27 != 0xf; lVar27 = lVar27 + 1) {
              ptr_00[lVar27] = iVar44;
              ptr_01[lVar27] = iVar44;
            }
            for (; (int)uVar31 < (int)uVar15; uVar31 = uVar31 + 1) {
              ptr_00[uVar31 + 0xf] = iVar44;
              ptr_01[uVar31 + 0xf] = iVar44;
            }
            uVar25 = _s1Len - 1;
            auVar57 = ZEXT3264(local_140);
            auVar55 = ZEXT3264(local_1c0);
            lVar27 = uVar39 * 4;
            local_2a0._8_8_ = 0x80009000a000b;
            local_2a0._0_8_ = 0xc000d000e000f;
            local_2a0._16_8_ = 0x4000500060007;
            local_2a0._24_8_ = 0x100020003;
            local_330 = 0;
            local_180._2_2_ = iVar44;
            local_180._0_2_ = iVar44;
            local_180._4_2_ = iVar44;
            local_180._6_2_ = iVar44;
            local_180._8_2_ = iVar44;
            local_180._10_2_ = iVar44;
            local_180._12_2_ = iVar44;
            local_180._14_2_ = iVar44;
            local_180._16_2_ = iVar44;
            local_180._18_2_ = iVar44;
            local_180._20_2_ = iVar44;
            local_180._22_2_ = iVar44;
            local_180._24_2_ = iVar44;
            local_180._26_2_ = iVar44;
            local_180._28_2_ = iVar44;
            local_180._30_2_ = iVar44;
            auVar58 = ZEXT3264(local_180);
            local_1a0._2_2_ = sVar28;
            local_1a0._0_2_ = sVar28;
            local_1a0._4_2_ = sVar28;
            local_1a0._6_2_ = sVar28;
            local_1a0._10_2_ = sVar28;
            local_1a0._8_2_ = sVar28;
            local_1a0._12_2_ = sVar28;
            local_1a0._14_2_ = sVar28;
            local_1a0._18_2_ = sVar28;
            local_1a0._16_2_ = sVar28;
            local_1a0._20_2_ = sVar28;
            local_1a0._22_2_ = sVar28;
            local_1a0._26_2_ = sVar28;
            local_1a0._24_2_ = sVar28;
            local_1a0._28_2_ = sVar28;
            local_1a0._30_2_ = sVar28;
            for (uVar31 = 0; (long)uVar31 < lVar40; uVar31 = uVar31 + 0x10) {
              if (matrix->type == 0) {
                uVar35 = (uint)local_3a8[uVar31];
                uVar16 = (uint)local_3a8[uVar31 + 1];
                uVar17 = (uint)local_3a8[uVar31 + 2];
                uVar38 = (uint)local_3a8[uVar31 + 3];
                uVar18 = (uint)local_3a8[uVar31 + 4];
                uVar29 = (uint)local_3a8[uVar31 + 5];
                uVar19 = (uint)local_3a8[uVar31 + 6];
                uVar36 = (uint)local_3a8[uVar31 + 7];
                uVar20 = (uint)local_3a8[uVar31 + 8];
                uVar43 = (uint)local_3a8[uVar31 + 9];
                uVar21 = (uint)local_3a8[uVar31 + 10];
                uVar32 = (uint)local_3a8[uVar31 + 0xb];
                uVar22 = (uint)local_3a8[uVar31 + 0xc];
                uVar26 = (uint)local_3a8[uVar31 + 0xd];
                uVar23 = (uint)local_3a8[uVar31 + 0xe];
                uVar12 = (int)local_3a8[uVar31 + 0xf];
              }
              else {
                uVar35 = (uint)uVar31;
                uVar16 = uVar25;
                if ((long)(uVar31 | 1) < lVar40) {
                  uVar16 = uVar35 | 1;
                }
                uVar17 = uVar35 | 2;
                if (lVar40 <= (long)(uVar31 | 2)) {
                  uVar17 = uVar25;
                }
                uVar38 = uVar35 | 3;
                if (lVar40 <= (long)(uVar31 | 3)) {
                  uVar38 = uVar25;
                }
                uVar18 = uVar35 | 4;
                if (lVar40 <= (long)(uVar31 | 4)) {
                  uVar18 = uVar25;
                }
                uVar29 = uVar35 | 5;
                if (lVar40 <= (long)(uVar31 | 5)) {
                  uVar29 = uVar25;
                }
                uVar19 = uVar35 | 6;
                if (lVar40 <= (long)(uVar31 | 6)) {
                  uVar19 = uVar25;
                }
                uVar36 = uVar35 | 7;
                if (lVar40 <= (long)(uVar31 | 7)) {
                  uVar36 = uVar25;
                }
                uVar20 = uVar35 | 8;
                if (lVar40 <= (long)(uVar31 | 8)) {
                  uVar20 = uVar25;
                }
                uVar43 = uVar35 | 9;
                if (lVar40 <= (long)(uVar31 | 9)) {
                  uVar43 = uVar25;
                }
                uVar21 = uVar35 | 10;
                if (lVar40 <= (long)(uVar31 | 10)) {
                  uVar21 = uVar25;
                }
                uVar32 = uVar35 | 0xb;
                if (lVar40 <= (long)(uVar31 | 0xb)) {
                  uVar32 = uVar25;
                }
                uVar22 = uVar35 | 0xc;
                if (lVar40 <= (long)(uVar31 | 0xc)) {
                  uVar22 = uVar25;
                }
                uVar26 = uVar35 | 0xd;
                if (lVar40 <= (long)(uVar31 | 0xd)) {
                  uVar26 = uVar25;
                }
                uVar23 = uVar35 | 0xe;
                if (lVar40 <= (long)(uVar31 | 0xe)) {
                  uVar23 = uVar25;
                }
                uVar12 = uVar35 | 0xf;
                if (lVar40 <= (long)(uVar31 | 0xf)) {
                  uVar12 = uVar25;
                }
              }
              local_2b0 = uVar31 | 1;
              local_2b8 = uVar31 | 0xe;
              local_2c0 = uVar31 | 10;
              local_2c8 = uVar31 | 0xb;
              local_2d0 = uVar31 | 0xc;
              local_2d8 = uVar31 | 0xd;
              local_2e0 = uVar31 | 7;
              local_2e8 = uVar31 | 8;
              local_2f0 = uVar31 | 9;
              local_2f8 = uVar31 | 0xf;
              local_380 = uVar31 | 2;
              local_388 = uVar31 | 3;
              local_390 = uVar31 | 4;
              local_398 = uVar31 | 5;
              local_3a0 = uVar31 | 6;
              iVar13 = matrix->size;
              piVar3 = matrix->matrix;
              auVar45._2_2_ = local_100;
              auVar45._0_2_ = local_100;
              auVar45._4_2_ = local_100;
              auVar45._6_2_ = local_100;
              auVar45._8_2_ = local_100;
              auVar45._10_2_ = local_100;
              auVar45._12_2_ = local_100;
              auVar45._14_2_ = local_100;
              auVar45._16_2_ = local_100;
              auVar45._18_2_ = local_100;
              auVar45._20_2_ = local_100;
              auVar45._22_2_ = local_100;
              auVar45._24_2_ = local_100;
              auVar45._26_2_ = local_100;
              auVar45._28_2_ = local_100;
              auVar45._30_2_ = local_100;
              auVar6 = vpcmpgtw_avx2(auVar45,local_2a0);
              auVar10._2_2_ = iVar44;
              auVar10._0_2_ = iVar44;
              auVar10._4_2_ = iVar44;
              auVar10._6_2_ = iVar44;
              auVar10._8_2_ = iVar44;
              auVar10._10_2_ = iVar44;
              auVar10._12_2_ = iVar44;
              auVar10._14_2_ = iVar44;
              auVar10._16_2_ = iVar44;
              auVar10._18_2_ = iVar44;
              auVar10._20_2_ = iVar44;
              auVar10._22_2_ = iVar44;
              auVar10._24_2_ = iVar44;
              auVar10._26_2_ = iVar44;
              auVar10._28_2_ = iVar44;
              auVar10._30_2_ = iVar44;
              auVar9 = vpmovsxbw_avx2(_DAT_008a5c84);
              auVar51 = local_e0;
              auVar45 = local_e0;
              auVar46 = auVar10;
              for (uVar37 = 0; (~((int)uVar15 >> 0x1f) & uVar15) != uVar37; uVar37 = uVar37 + 1) {
                auVar47 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar36 * iVar13) +
                                                           (long)ptr[uVar37 + 8]]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(uVar19 * iVar13) +
                                                       (long)ptr[uVar37 + 9]),1);
                auVar47 = vpinsrw_avx(auVar47,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar29 * iVar13) +
                                                               (long)ptr[uVar37 + 10]),2);
                auVar47 = vpinsrw_avx(auVar47,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar18 * iVar13) +
                                                               (long)ptr[uVar37 + 0xb]),3);
                auVar47 = vpinsrw_avx(auVar47,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar38 * iVar13) +
                                                               (long)ptr[uVar37 + 0xc]),4);
                auVar47 = vpinsrw_avx(auVar47,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar17 * iVar13) +
                                                               (long)ptr[uVar37 + 0xd]),5);
                auVar47 = vpinsrw_avx(auVar47,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar16 * iVar13) +
                                                               (long)ptr[uVar37 + 0xe]),6);
                auVar47 = vpinsrw_avx(auVar47,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar35 * iVar13) +
                                                               (long)ptr[uVar37 + 0xf]),7);
                auVar49 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar12 * iVar13) +
                                                           (long)ptr[uVar37]]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(uVar23 * iVar13) +
                                                       (long)ptr[uVar37 + 1]),1);
                auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar26 * iVar13) +
                                                               (long)ptr[uVar37 + 2]),2);
                auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar22 * iVar13) +
                                                               (long)ptr[uVar37 + 3]),3);
                auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar32 * iVar13) +
                                                               (long)ptr[uVar37 + 4]),4);
                auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar21 * iVar13) +
                                                               (long)ptr[uVar37 + 5]),5);
                auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar43 * iVar13) +
                                                               (long)ptr[uVar37 + 6]),6);
                auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar20 * iVar13) +
                                                               (long)ptr[uVar37 + 7]),7);
                iVar1 = ptr_00[uVar37 + 0xf];
                auVar52._2_2_ = iVar1;
                auVar52._0_2_ = iVar1;
                auVar52._4_2_ = iVar1;
                auVar52._6_2_ = iVar1;
                auVar52._8_2_ = iVar1;
                auVar52._10_2_ = iVar1;
                auVar52._12_2_ = iVar1;
                auVar52._14_2_ = iVar1;
                auVar52._16_2_ = iVar1;
                auVar52._18_2_ = iVar1;
                auVar52._20_2_ = iVar1;
                auVar52._22_2_ = iVar1;
                auVar52._24_2_ = iVar1;
                auVar52._26_2_ = iVar1;
                auVar52._28_2_ = iVar1;
                auVar52._30_2_ = iVar1;
                auVar53 = vpalignr_avx2(ZEXT1632(auVar45._16_16_),auVar45,2);
                auVar52 = vpblendw_avx2(auVar53,auVar52,0x80);
                auVar52 = vpblendd_avx2(auVar53,auVar52,0xf0);
                auVar46 = vpalignr_avx2(ZEXT1632(auVar46._16_16_),auVar46,2);
                iVar1 = ptr_01[uVar37 + 0xf];
                auVar53._2_2_ = iVar1;
                auVar53._0_2_ = iVar1;
                auVar53._4_2_ = iVar1;
                auVar53._6_2_ = iVar1;
                auVar53._8_2_ = iVar1;
                auVar53._10_2_ = iVar1;
                auVar53._12_2_ = iVar1;
                auVar53._14_2_ = iVar1;
                auVar53._16_2_ = iVar1;
                auVar53._18_2_ = iVar1;
                auVar53._20_2_ = iVar1;
                auVar53._22_2_ = iVar1;
                auVar53._24_2_ = iVar1;
                auVar53._26_2_ = iVar1;
                auVar53._28_2_ = iVar1;
                auVar53._30_2_ = iVar1;
                auVar53 = vpblendw_avx2(auVar46,auVar53,0x80);
                auVar53 = vpblendd_avx2(auVar46,auVar53,0xf0);
                auVar54._2_2_ = local_80;
                auVar54._0_2_ = local_80;
                auVar54._4_2_ = local_80;
                auVar54._6_2_ = local_80;
                auVar54._8_2_ = local_80;
                auVar54._10_2_ = local_80;
                auVar54._12_2_ = local_80;
                auVar54._14_2_ = local_80;
                auVar54._16_2_ = local_80;
                auVar54._18_2_ = local_80;
                auVar54._20_2_ = local_80;
                auVar54._22_2_ = local_80;
                auVar54._24_2_ = local_80;
                auVar54._26_2_ = local_80;
                auVar54._28_2_ = local_80;
                auVar54._30_2_ = local_80;
                auVar46 = vpsubsw_avx2(auVar52,auVar54);
                auVar7._2_2_ = local_a0;
                auVar7._0_2_ = local_a0;
                auVar7._4_2_ = local_a0;
                auVar7._6_2_ = local_a0;
                auVar7._8_2_ = local_a0;
                auVar7._10_2_ = local_a0;
                auVar7._12_2_ = local_a0;
                auVar7._14_2_ = local_a0;
                auVar7._16_2_ = local_a0;
                auVar7._18_2_ = local_a0;
                auVar7._20_2_ = local_a0;
                auVar7._22_2_ = local_a0;
                auVar7._24_2_ = local_a0;
                auVar7._26_2_ = local_a0;
                auVar7._28_2_ = local_a0;
                auVar7._30_2_ = local_a0;
                auVar53 = vpsubsw_avx2(auVar53,auVar7);
                auVar46 = vpmaxsw_avx2(auVar46,auVar53);
                auVar45 = vpsubsw_avx2(auVar45,auVar54);
                auVar10 = vpsubsw_avx2(auVar10,auVar7);
                auVar53 = vpmaxsw_avx2(auVar45,auVar10);
                auVar48._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar49;
                auVar48._16_16_ = ZEXT116(1) * auVar47;
                auVar45 = vpaddsw_avx2(auVar51,auVar48);
                auVar10 = vpmaxsw_avx2(auVar53,auVar46);
                auVar10 = vpmaxsw_avx2(auVar10,_DAT_008a5840);
                auVar51 = vpmaxsw_avx2(auVar45,auVar10);
                auVar10 = vpcmpeqw_avx2(auVar9,_DAT_008a5a80);
                auVar45 = vpandn_avx2(auVar10,auVar51);
                if (0xf < uVar37) {
                  local_1a0 = vpminsw_avx2(local_1a0,auVar45);
                  local_180 = vpmaxsw_avx2(local_180,auVar45);
                }
                piVar4 = ((ppVar14->field_4).rowcols)->score_row;
                auVar47 = auVar45._0_16_;
                auVar49 = auVar45._16_16_;
                if (uVar37 < uVar39) {
                  uVar30 = vpextrw_avx(auVar49,7);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + local_330) = uVar30;
                }
                if (uVar37 - 1 < uVar39 && (long)local_2b0 < lVar40) {
                  uVar30 = vpextrw_avx(auVar49,6);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_2b0 + -4) = uVar30;
                }
                if (((long)local_380 < lVar40) && ((long)(uVar37 - 2) < (long)uVar39 && 1 < uVar37))
                {
                  uVar30 = vpextrw_avx(auVar49,5);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_380 + -8) = uVar30;
                }
                if (((long)local_388 < lVar40) && ((long)(uVar37 - 3) < (long)uVar39 && 2 < uVar37))
                {
                  uVar30 = vpextrw_avx(auVar49,4);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_388 + -0xc) = uVar30;
                }
                if (((long)local_390 < lVar40) && ((long)(uVar37 - 4) < (long)uVar39 && 3 < uVar37))
                {
                  uVar30 = vpextrw_avx(auVar49,3);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_390 + -0x10) = uVar30;
                }
                if (((long)local_398 < lVar40) && ((long)(uVar37 - 5) < (long)uVar39 && 4 < uVar37))
                {
                  uVar30 = vpextrw_avx(auVar49,2);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_398 + -0x14) = uVar30;
                }
                if (((long)local_3a0 < lVar40) && ((long)(uVar37 - 6) < (long)uVar39 && 5 < uVar37))
                {
                  uVar30 = vpextrw_avx(auVar49,1);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_3a0 + -0x18) = uVar30;
                }
                if (((long)local_2e0 < lVar40) && ((long)(uVar37 - 7) < (long)uVar39 && 6 < uVar37))
                {
                  uVar30 = vpextrw_avx(auVar49,0);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_2e0 + -0x1c) = uVar30;
                }
                if (((long)local_2e8 < lVar40) && ((long)(uVar37 - 8) < (long)uVar39 && 7 < uVar37))
                {
                  uVar30 = vpextrw_avx(auVar47,7);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_2e8 + -0x20) = uVar30;
                }
                if (((long)local_2f0 < lVar40) && ((long)(uVar37 - 9) < (long)uVar39 && 8 < uVar37))
                {
                  uVar30 = vpextrw_avx(auVar47,6);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_2f0 + -0x24) = uVar30;
                }
                if (((long)local_2c0 < lVar40) && ((long)(uVar37 - 10) < (long)uVar39 && 9 < uVar37)
                   ) {
                  uVar30 = vpextrw_avx(auVar47,5);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_2c0 + -0x28) = uVar30;
                }
                if (((long)local_2c8 < lVar40) &&
                   ((long)(uVar37 - 0xb) < (long)uVar39 && 10 < uVar37)) {
                  uVar30 = vpextrw_avx(auVar47,4);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_2c8 + -0x2c) = uVar30;
                }
                if (((long)local_2d0 < lVar40) &&
                   ((long)(uVar37 - 0xc) < (long)uVar39 && 0xb < uVar37)) {
                  uVar30 = vpextrw_avx(auVar47,3);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_2d0 + -0x30) = uVar30;
                }
                if (((long)local_2d8 < lVar40) &&
                   ((long)(uVar37 - 0xd) < (long)uVar39 && 0xc < uVar37)) {
                  uVar30 = vpextrw_avx(auVar47,2);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_2d8 + -0x34) = uVar30;
                }
                if (((long)local_2b8 < lVar40) &&
                   ((long)(uVar37 - 0xe) < (long)uVar39 && 0xd < uVar37)) {
                  uVar30 = vpextrw_avx(auVar47,1);
                  *(undefined4 *)((long)piVar4 + uVar37 * 4 + lVar27 * local_2b8 + -0x38) = uVar30;
                }
                auVar8._2_2_ = iVar44;
                auVar8._0_2_ = iVar44;
                auVar8._4_2_ = iVar44;
                auVar8._6_2_ = iVar44;
                auVar8._8_2_ = iVar44;
                auVar8._10_2_ = iVar44;
                auVar8._12_2_ = iVar44;
                auVar8._14_2_ = iVar44;
                auVar8._16_2_ = iVar44;
                auVar8._18_2_ = iVar44;
                auVar8._20_2_ = iVar44;
                auVar8._22_2_ = iVar44;
                auVar8._24_2_ = iVar44;
                auVar8._26_2_ = iVar44;
                auVar8._28_2_ = iVar44;
                auVar8._30_2_ = iVar44;
                auVar46 = vpblendvb_avx2(auVar46,auVar8,auVar10);
                if (0xe < uVar37 && (long)local_2f8 < lVar40) {
                  *(uint *)((long)piVar4 + uVar37 * 4 + lVar27 * local_2f8 + -0x3c) =
                       auVar45._0_4_ & 0xffff;
                }
                auVar11._2_2_ = local_c0;
                auVar11._0_2_ = local_c0;
                auVar11._4_2_ = local_c0;
                auVar11._6_2_ = local_c0;
                auVar11._8_2_ = local_c0;
                auVar11._10_2_ = local_c0;
                auVar11._12_2_ = local_c0;
                auVar11._14_2_ = local_c0;
                auVar11._16_2_ = local_c0;
                auVar11._18_2_ = local_c0;
                auVar11._20_2_ = local_c0;
                auVar11._22_2_ = local_c0;
                auVar11._24_2_ = local_c0;
                auVar11._26_2_ = local_c0;
                auVar11._28_2_ = local_c0;
                auVar11._30_2_ = local_c0;
                auVar7 = vpcmpgtw_avx2(auVar11,auVar9);
                auVar7 = vpand_avx2(auVar6,auVar7);
                auVar54 = vpsraw_avx2(auVar9,0xf);
                auVar54 = vpandn_avx2(auVar54,auVar7);
                auVar47 = vpacksswb_avx(auVar54._0_16_,auVar54._16_16_);
                auVar56 = auVar57._0_32_;
                auVar48 = vpcmpeqw_avx2(auVar56,auVar45);
                auVar8 = vpcmpgtw_avx2(auVar45,auVar56);
                auVar7 = vpand_avx2(auVar8,auVar54);
                auVar51 = vpblendvb_avx2(auVar56,auVar51,auVar7);
                auVar57 = ZEXT3264(auVar51);
                auVar49 = vpacksswb_avx(auVar7._0_16_,auVar7._16_16_);
                auVar51 = vpcmpgtw_avx2(auVar55._0_32_,auVar9);
                auVar51 = vpand_avx2(auVar48,auVar51);
                auVar5 = vpacksswb_avx(auVar51._0_16_,auVar51._16_16_);
                auVar47 = vpblendvb_avx(auVar49,auVar47,auVar5);
                auVar56._2_2_ = iVar44;
                auVar56._0_2_ = iVar44;
                auVar56._4_2_ = iVar44;
                auVar56._6_2_ = iVar44;
                auVar56._8_2_ = iVar44;
                auVar56._10_2_ = iVar44;
                auVar56._12_2_ = iVar44;
                auVar56._14_2_ = iVar44;
                auVar56._16_2_ = iVar44;
                auVar56._18_2_ = iVar44;
                auVar56._20_2_ = iVar44;
                auVar56._22_2_ = iVar44;
                auVar56._24_2_ = iVar44;
                auVar56._26_2_ = iVar44;
                auVar56._28_2_ = iVar44;
                auVar56._30_2_ = iVar44;
                auVar10 = vpblendvb_avx2(auVar53,auVar56,auVar10);
                auVar53 = vpmovsxbw_avx2(auVar47);
                auVar53 = vpblendvb_avx2(auVar58._0_32_,local_2a0,auVar53);
                auVar58 = ZEXT3264(auVar53);
                auVar51 = vpor_avx2(auVar51,auVar8);
                auVar51 = vpand_avx2(auVar54,auVar51);
                auVar50._8_2_ = 1;
                auVar50._0_8_ = 0x1000100010001;
                auVar50._10_2_ = 1;
                auVar50._12_2_ = 1;
                auVar50._14_2_ = 1;
                auVar50._16_2_ = 1;
                auVar50._18_2_ = 1;
                auVar50._20_2_ = 1;
                auVar50._22_2_ = 1;
                auVar50._24_2_ = 1;
                auVar50._26_2_ = 1;
                auVar50._28_2_ = 1;
                auVar50._30_2_ = 1;
                auVar51 = vpblendvb_avx2(auVar55._0_32_,auVar9,auVar51);
                auVar55 = ZEXT3264(auVar51);
                auVar9 = vpaddsw_avx2(auVar9,auVar50);
                ptr_00[uVar37] = auVar45._0_2_;
                vpextrw_avx(auVar46._0_16_,0);
                auVar51 = auVar52;
              }
              auVar46._8_2_ = 0x10;
              auVar46._0_8_ = 0x10001000100010;
              auVar46._10_2_ = 0x10;
              auVar46._12_2_ = 0x10;
              auVar46._14_2_ = 0x10;
              auVar46._16_2_ = 0x10;
              auVar46._18_2_ = 0x10;
              auVar46._20_2_ = 0x10;
              auVar46._22_2_ = 0x10;
              auVar46._24_2_ = 0x10;
              auVar46._26_2_ = 0x10;
              auVar46._28_2_ = 0x10;
              auVar46._30_2_ = 0x10;
              local_2a0 = vpaddsw_avx2(local_2a0,auVar46);
              local_330 = local_330 + uVar39 * 0x40;
            }
            local_140 = auVar57._0_32_;
            local_1c0 = auVar55._0_32_;
            local_160 = auVar58._0_32_;
            iVar42 = 0;
            iVar13 = 0;
            for (lVar40 = 0; uVar34 = (ushort)uVar41, (int)lVar40 != 0x10; lVar40 = lVar40 + 1) {
              uVar2 = *(ushort *)(local_140 + lVar40 * 2);
              if ((short)uVar34 < (short)uVar2) {
                iVar13 = (int)*(short *)(local_160 + lVar40 * 2);
                iVar42 = (int)*(short *)(local_1c0 + lVar40 * 2);
                uVar41 = (uint)uVar2;
              }
              else if (uVar2 == uVar34) {
                iVar33 = (int)*(short *)(local_1c0 + lVar40 * 2);
                if (iVar33 < iVar42) {
                  iVar13 = (int)*(short *)(local_160 + lVar40 * 2);
                  iVar42 = iVar33;
                }
                else if ((iVar42 == iVar33) && (*(short *)(local_160 + lVar40 * 2) <= iVar13)) {
                  iVar13 = (int)*(short *)(local_160 + lVar40 * 2);
                }
              }
            }
            auVar6._2_2_ = iVar44;
            auVar6._0_2_ = iVar44;
            auVar6._4_2_ = iVar44;
            auVar6._6_2_ = iVar44;
            auVar6._8_2_ = iVar44;
            auVar6._10_2_ = iVar44;
            auVar6._12_2_ = iVar44;
            auVar6._14_2_ = iVar44;
            auVar6._16_2_ = iVar44;
            auVar6._18_2_ = iVar44;
            auVar6._20_2_ = iVar44;
            auVar6._22_2_ = iVar44;
            auVar6._24_2_ = iVar44;
            auVar6._26_2_ = iVar44;
            auVar6._28_2_ = iVar44;
            auVar6._30_2_ = iVar44;
            auVar9 = vpcmpgtw_avx2(auVar6,local_1a0);
            auVar51._2_2_ = sVar28;
            auVar51._0_2_ = sVar28;
            auVar51._4_2_ = sVar28;
            auVar51._6_2_ = sVar28;
            auVar51._8_2_ = sVar28;
            auVar51._10_2_ = sVar28;
            auVar51._12_2_ = sVar28;
            auVar51._14_2_ = sVar28;
            auVar51._16_2_ = sVar28;
            auVar51._18_2_ = sVar28;
            auVar51._20_2_ = sVar28;
            auVar51._22_2_ = sVar28;
            auVar51._24_2_ = sVar28;
            auVar51._26_2_ = sVar28;
            auVar51._28_2_ = sVar28;
            auVar51._30_2_ = sVar28;
            auVar45 = vpcmpgtw_avx2(local_180,auVar51);
            auVar9 = vpor_avx2(auVar9,auVar45);
            if ((((((((((((((((((((((((((((((((auVar9 >> 7 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar9 >> 0xf & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar9 >> 0x17 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar9 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar9 >> 0x27 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar9 >> 0x2f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar9 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar9 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar9 >> 0x47 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar9 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar9 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar9 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar9 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar9 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || SUB321(auVar9 >> 0x7f,0) != '\0') ||
                              (auVar9 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar9 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar9 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar9 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar9 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar9 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar9 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar9 >> 0xbf,0) != '\0') ||
                      (auVar9 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar9 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar9 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar9 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar9 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar9 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar9 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                auVar9[0x1f] < '\0') {
              *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
              uVar34 = 0;
              iVar42 = 0;
              iVar13 = 0;
            }
            ppVar14->score = (int)(short)uVar34;
            ppVar14->end_query = iVar13;
            ppVar14->end_ref = iVar42;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_3a8);
              return ppVar14;
            }
            return ppVar14;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar24 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_0075baf4;
        __format = "%s: %s must be > 0\n";
        pcVar24 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_diag_avx2_256_16",pcVar24);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vJLimit = _mm256_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            vWH = _mm256_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi16(vJ, vNegOne),
                        _mm256_cmplt_epi16_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi16(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi16(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi16_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}